

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

int ppc_store_slb(PowerPCCPU_conflict3 *cpu,target_ulong slot,target_ulong esid,target_ulong vsid)

{
  PPCHash64SegmentPageSizes *pPVar1;
  PPCHash64Options *pPVar2;
  PPCHash64SegmentPageSizes *pPVar3;
  int iVar4;
  PPCHash64SegmentPageSizes *pPVar5;
  long lVar6;
  
  iVar4 = -1;
  if ((((-1 < (long)vsid) && ((esid & 0x7ffffff) == 0)) &&
      (pPVar2 = cpu->hash64_opts, slot < pPVar2->slb_size)) &&
     ((vsid >> 0x3e == 0 || ((pPVar2->flags & 1) != 0)))) {
    lVar6 = 9;
    pPVar5 = (PPCHash64SegmentPageSizes *)pPVar2[-1].sps[7].enc;
    do {
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        return -1;
      }
      if (pPVar5[1].page_shift == 0) {
        return -1;
      }
      pPVar1 = pPVar5 + 1;
      pPVar3 = pPVar5 + 1;
      pPVar5 = pPVar1;
    } while (((uint)vsid & 0x130) != pPVar3->slb_enc);
    (cpu->env).slb[slot].esid = esid;
    (cpu->env).slb[slot].vsid = vsid;
    (cpu->env).slb[slot].sps = pPVar1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int ppc_store_slb(PowerPCCPU *cpu, target_ulong slot,
                  target_ulong esid, target_ulong vsid)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t *slb = &env->slb[slot];
    const PPCHash64SegmentPageSizes *sps = NULL;
    int i;

    if (slot >= cpu->hash64_opts->slb_size) {
        return -1; /* Bad slot number */
    }
    if (esid & ~(SLB_ESID_ESID | SLB_ESID_V)) {
        return -1; /* Reserved bits set */
    }
    if (vsid & (SLB_VSID_B & ~SLB_VSID_B_1T)) {
        return -1; /* Bad segment size */
    }
    if ((vsid & SLB_VSID_B) && !(ppc_hash64_has(cpu, PPC_HASH64_1TSEG))) {
        return -1; /* 1T segment on MMU that doesn't support it */
    }

    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps1 = &cpu->hash64_opts->sps[i];

        if (!sps1->page_shift) {
            break;
        }

        if ((vsid & SLB_VSID_LLP_MASK) == sps1->slb_enc) {
            sps = sps1;
            break;
        }
    }

    if (!sps) {
#if 0
        error_report("Bad page size encoding in SLB store: slot "TARGET_FMT_lu
                     " esid 0x"TARGET_FMT_lx" vsid 0x"TARGET_FMT_lx,
                     slot, esid, vsid);
#endif
        return -1;
    }

    slb->esid = esid;
    slb->vsid = vsid;
    slb->sps = sps;

#if 0
    LOG_SLB("%s: " TARGET_FMT_lu " " TARGET_FMT_lx " - " TARGET_FMT_lx
            " => %016" PRIx64 " %016" PRIx64 "\n", __func__, slot, esid, vsid,
            slb->esid, slb->vsid);
#endif

    return 0;
}